

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O0

UniValue * __thiscall
GenerateToAddressRequestHandler::PrepareRequest
          (GenerateToAddressRequestHandler *this,string *method,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string *in_RCX;
  UniValue *in_RDX;
  UniValue *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue params;
  UniValue *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffed0;
  UniValue *in_stack_fffffffffffffed8;
  UniValue *strMethod;
  allocator<char> local_fa;
  allocator<char> local_f9 [241];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  strMethod = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
             (char *)in_RCX,(allocator<char> *)in_stack_fffffffffffffed8);
  RPCConvertValues(in_RCX,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffed8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe98);
  std::allocator<char>::~allocator(local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
             (char *)in_RCX,(allocator<char> *)in_stack_fffffffffffffed8);
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  JSONRPCRequestObj((string *)strMethod,in_RSI,in_RDX);
  UniValue::~UniValue(in_stack_fffffffffffffe98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe98);
  std::allocator<char>::~allocator(&local_fa);
  UniValue::~UniValue(in_stack_fffffffffffffe98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        address_str = args.at(1);
        UniValue params{RPCConvertValues("generatetoaddress", args)};
        return JSONRPCRequestObj("generatetoaddress", params, 1);
    }